

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O1

void apet_force(CHAR_DATA *ch,char *cmd,int delay)

{
  short sVar1;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  CHAR_DATA *local_320;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  char *local_278 [2];
  undefined1 local_268 [32];
  char local_248 [536];
  
  local_268._16_8_ = 0;
  local_268._0_8_ = &PTR_grow_00457340;
  local_268._24_8_ = 500;
  fmt.size_ = 0x2a;
  fmt.data_ = "You feel the irresistible urge to \'{}}\'.\n\r";
  args.field_1.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278
  ;
  args.desc_ = 0xc;
  local_320 = ch;
  local_278[0] = cmd;
  local_268._8_8_ = local_248;
  ::fmt::v9::detail::vformat_to<char>((buffer<char> *)local_268,fmt,args,(locale_ref)0x0);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,local_268._8_8_,(char *)(local_268._8_8_ + local_268._16_8_));
  if ((char *)local_268._8_8_ != local_248) {
    operator_delete((void *)local_268._8_8_,local_268._24_8_);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"apet_force","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"interpret_queue","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,cmd,(allocator<char> *)local_278);
  CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>
            (&RS.Queue,delay,&local_2b8,&local_2d8,interpret_queue,&local_320,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"apet_force","");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"send_to_char_queue","");
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
            (&RS.Queue,delay,&local_2f8,&local_318,send_to_char_queue,&local_298,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  sVar1 = 0x14;
  if (local_320->wait < 0x14) {
    sVar1 = local_320->wait;
  }
  local_320->wait = sVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void apet_force(CHAR_DATA *ch, const char *cmd, int delay)
{
	char *tcmd;

	auto buffer = fmt::format("You feel the irresistible urge to '{}}'.\n\r", cmd);

	RS.Queue.AddToQueue(delay, "apet_force", "interpret_queue", interpret_queue, ch, std::string(cmd));
	RS.Queue.AddToQueue(delay, "apet_force", "send_to_char_queue", send_to_char_queue, buffer, ch);

	ch->wait = std::min((int)ch->wait, 20);
}